

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O3

bool __thiscall
InsertProxyModel::insertColumns(InsertProxyModel *this,int column,int count,QModelIndex *parent)

{
  undefined1 uVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  
  if ((((parent->r < 0) || (parent->c < 0)) || (parent->m == (QAbstractItemModel *)0x0)) &&
     ((lVar3 = QAbstractProxyModel::sourceModel(), lVar3 != 0 && (-1 < column)))) {
    plVar4 = (long *)QAbstractProxyModel::sourceModel();
    iVar2 = (**(code **)(*plVar4 + 0x80))(plVar4);
    if (column <= iVar2) {
      plVar4 = (long *)QAbstractProxyModel::sourceModel();
      uVar1 = (**(code **)(*plVar4 + 0x100))(plVar4,column,count);
      return (bool)uVar1;
    }
  }
  return false;
}

Assistant:

bool InsertProxyModel::insertColumns(int column, int count, const QModelIndex &parent)
{
    if (parent.isValid())
        return false;
    if (!sourceModel())
        return false;
    if (column < 0 || column > sourceModel()->columnCount())
        return false;
    return sourceModel()->insertColumns(column, count);
}